

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.c
# Opt level: O2

void deCommandLine_selfTest(void)

{
  char *ref [1];
  
  ref[0] = "hello";
  testParse("hello",ref,1);
  testParse("hello world",&PTR_anon_var_dwarf_1a7a639_00c25410,2);
  ref[0] = "hello/world";
  testParse("hello/world",ref,1);
  testParse("hello/world --help",&PTR_anon_var_dwarf_1a7a677_00c25420,2);
  testParse("hello/world --help foo",(char **)&DAT_00c25430,3);
  testParse("hello\\world --help foo",(char **)&DAT_00c25450,3);
  testParse("\"hello/worl d\" --help --foo=\"bar\" \"ba z\\\"\"",(char **)&DAT_00c25470,4);
  testParse("\'hello/worl d\' --help --foo=\'bar\' \'ba z\\\'\'",(char **)&DAT_00c25490,4);
  testParse("hello \"\'world\'\"",&PTR_anon_var_dwarf_1a7a639_00c254b0,2);
  testParse("hello \'\"world\"\'",&PTR_anon_var_dwarf_1a7a639_00c254c0,2);
  testParse("hello \"world\\n\"",&PTR_anon_var_dwarf_1a7a639_00c254d0,2);
  return;
}

Assistant:

void deCommandLine_selfTest (void)
{
	{
		const char* cmdLine	= "hello";
		const char* ref[]	= { "hello" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "hello world";
		const char* ref[]	= { "hello", "world" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "hello/world";
		const char* ref[]	= { "hello/world" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "hello/world --help";
		const char* ref[]	= { "hello/world", "--help" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "hello/world --help foo";
		const char* ref[]	= { "hello/world", "--help", "foo" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "hello\\world --help foo";
		const char* ref[]	= { "hello\\world", "--help", "foo" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "\"hello/worl d\" --help --foo=\"bar\" \"ba z\\\"\"";
		const char* ref[]	= { "hello/worl d", "--help", "--foo=bar", "ba z\"" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "'hello/worl d' --help --foo='bar' 'ba z\\\''";
		const char* ref[]	= { "hello/worl d", "--help", "--foo=bar", "ba z'" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "hello \"'world'\"";
		const char* ref[]	= { "hello", "'world'" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "hello '\"world\"'";
		const char* ref[]	= { "hello", "\"world\"" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "hello \"world\\n\"";
		const char* ref[]	= { "hello", "world\n" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
}